

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowConstantAggregatorLocalState::~WindowConstantAggregatorLocalState
          (WindowConstantAggregatorLocalState *this)

{
  ~WindowConstantAggregatorLocalState(this);
  operator_delete(this);
  return;
}

Assistant:

~WindowConstantAggregatorLocalState() override {
	}